

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

bool __thiscall
ConsistencyChecker::checkOpMisuse(ConsistencyChecker *this,OpTpl *op,Constructor *ct)

{
  VarnodeTpl *pVVar1;
  SleighCompile *this_00;
  char cVar2;
  mapped_type *loc;
  undefined1 local_40 [32];
  
  if (op->opc == CPUI_INT_LESS) {
    pVVar1 = (op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    cVar2 = ConstTpl::isConstSpace();
    if (((cVar2 != '\0') && (*(int *)(pVVar1 + 0x20) == 0)) && (*(long *)(pVVar1 + 0x30) == 0)) {
      this_00 = this->compiler;
      local_40._0_8_ = ct;
      loc = std::
            map<Constructor_*,_Location,_std::less<Constructor_*>,_std::allocator<std::pair<Constructor_*const,_Location>_>_>
            ::at(&this_00->ctorLocationMap,(key_type *)local_40);
      local_40._0_8_ = (key_type)(local_40 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Unsigned comparison with zero is always false","");
      SleighCompile::reportWarning(this_00,loc,(string *)local_40);
      if ((key_type)local_40._0_8_ != (key_type)(local_40 + 0x10)) {
        operator_delete((void *)local_40._0_8_);
      }
    }
  }
  return true;
}

Assistant:

bool ConsistencyChecker::checkOpMisuse(OpTpl *op,Constructor *ct)

{
  switch(op->getOpcode()) {
  case CPUI_INT_LESS:
    {
      VarnodeTpl *vn = op->getIn(1);
      if (vn->getSpace().isConstSpace() && vn->getOffset().isZero()) {
	compiler->reportWarning(compiler->getLocation(ct), "Unsigned comparison with zero is always false");
      }
    }
    break;
  default:
    break;
  }
  return true;
}